

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

BCReg expr_list(LexState *ls,ExpDesc *v)

{
  int iVar1;
  BCReg BVar2;
  
  expr(ls,v);
  BVar2 = 1;
  while( true ) {
    iVar1 = lex_opt(ls,0x2c);
    if (iVar1 == 0) break;
    expr_tonextreg(ls->fs,v);
    expr(ls,v);
    BVar2 = BVar2 + 1;
  }
  return BVar2;
}

Assistant:

static BCReg expr_list(LexState *ls, ExpDesc *v)
{
  BCReg n = 1;
  expr(ls, v);
  while (lex_opt(ls, ',')) {
    expr_tonextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}